

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FArrayBox.cpp
# Opt level: O0

void __thiscall amrex::FABio_8bit::skip(FABio_8bit *this,istream *is,FArrayBox *f,int nCompToSkip)

{
  int iVar1;
  Long LVar2;
  void *pvVar3;
  ulong uVar4;
  int in_ECX;
  BaseFab<double> *in_RDX;
  void *in_RSI;
  int k;
  int nbytes;
  Real mx;
  Real mn;
  Long siz;
  Box *bx;
  int local_50;
  int local_4c;
  double local_48;
  Box *in_stack_ffffffffffffffc0;
  
  BaseFab<double>::box(in_RDX);
  LVar2 = Box::numPts(in_stack_ffffffffffffffc0);
  for (local_50 = 0; local_50 < in_ECX; local_50 = local_50 + 1) {
    pvVar3 = (void *)std::istream::operator>>(in_RSI,(double *)&stack0xffffffffffffffc0);
    pvVar3 = (void *)std::istream::operator>>(pvVar3,&local_48);
    std::istream::operator>>(pvVar3,&local_4c);
    do {
      iVar1 = std::istream::get();
    } while (iVar1 != 10);
    std::istream::seekg((long)in_RSI,(_Ios_Seekdir)LVar2);
  }
  uVar4 = std::ios::fail();
  if ((uVar4 & 1) != 0) {
    Error_host((char *)in_stack_ffffffffffffffc0);
  }
  return;
}

Assistant:

void
FABio_8bit::skip (std::istream& is,
                  FArrayBox&    f,
                  int           nCompToSkip) const
{
    const Box& bx = f.box();
    Long siz      = bx.numPts();
    Real mn, mx;
    for(int nbytes, k = 0; k < nCompToSkip; ++k) {
        is >> mn >> mx >> nbytes;
        BL_ASSERT(nbytes == siz);
        while(is.get() != '\n') {
            ;  // ---- do nothing
        }
        is.seekg(siz, std::ios::cur);
    }

    if(is.fail()) {
        amrex::Error("FABio_8bit::skip() failed");
    }
}